

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O1

int add_linux_if(pcap_if_t **devlistp,char *ifname,int fd,char *errbuf)

{
  int iVar1;
  bpf_u_int32 flags;
  ushort **ppuVar2;
  int *piVar3;
  char *pcVar4;
  byte *pbVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  byte *pbVar9;
  ifreq ifrflags;
  char name [512];
  char local_250 [15];
  undefined1 local_241;
  short local_240;
  byte local_228 [512];
  
  bVar7 = *ifname;
  if ((char)bVar7 < '\x01') {
    pbVar5 = local_228;
  }
  else {
    ppuVar2 = __ctype_b_loc();
    pbVar9 = (byte *)(ifname + 1);
    pbVar5 = local_228;
    do {
      if ((*(byte *)((long)*ppuVar2 + (ulong)bVar7 * 2 + 1) & 0x20) != 0) break;
      if (bVar7 == 0x3a) {
        bVar7 = pbVar9[-1];
        if (-1 < (char)bVar7) {
          lVar6 = 0;
          goto LAB_0011b9c9;
        }
        break;
      }
      *pbVar5 = bVar7;
      pbVar5 = pbVar5 + 1;
      bVar7 = *pbVar9;
      pbVar9 = pbVar9 + 1;
    } while ('\0' < (char)bVar7);
  }
  goto LAB_0011b9f0;
  while( true ) {
    pbVar5[lVar6] = bVar7;
    bVar7 = pbVar9[lVar6];
    lVar6 = lVar6 + 1;
    if ((char)bVar7 < '\0') break;
LAB_0011b9c9:
    if ((*(byte *)((long)*ppuVar2 + (ulong)bVar7 * 2 + 1) & 8) == 0) break;
  }
  if (bVar7 == 0x3a) {
    pbVar5 = pbVar5 + lVar6;
  }
LAB_0011b9f0:
  iVar8 = 0;
  *pbVar5 = 0;
  strncpy(local_250,(char *)local_228,0x10);
  local_241 = 0;
  iVar1 = ioctl(fd,0x8913,local_250);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    if ((iVar1 != 6) && (iVar1 != 0x13)) {
      pcVar4 = pcap_strerror(iVar1);
      snprintf(errbuf,0x100,"SIOCGIFFLAGS: %.*s: %s",0x10,local_250,pcVar4);
      iVar8 = -1;
    }
  }
  else {
    flags = if_flags_to_pcap_flags((char *)local_228,(int)local_240);
    iVar1 = pcap_add_if(devlistp,(char *)local_228,flags,(char *)0x0,errbuf);
    iVar8 = -(uint)(iVar1 == -1);
  }
  return iVar8;
}

Assistant:

static int
add_linux_if(pcap_if_t **devlistp, const char *ifname, int fd, char *errbuf)
{
	const char *p;
	char name[512];	/* XXX - pick a size */
	char *q, *saveq;
	struct ifreq ifrflags;

	/*
	 * Get the interface name.
	 */
	p = ifname;
	q = &name[0];
	while (*p != '\0' && isascii(*p) && !isspace(*p)) {
		if (*p == ':') {
			/*
			 * This could be the separator between a
			 * name and an alias number, or it could be
			 * the separator between a name with no
			 * alias number and the next field.
			 *
			 * If there's a colon after digits, it
			 * separates the name and the alias number,
			 * otherwise it separates the name and the
			 * next field.
			 */
			saveq = q;
			while (isascii(*p) && isdigit(*p))
				*q++ = *p++;
			if (*p != ':') {
				/*
				 * That was the next field,
				 * not the alias number.
				 */
				q = saveq;
			}
			break;
		} else
			*q++ = *p++;
	}
	*q = '\0';

	/*
	 * Get the flags for this interface.
	 */
	strlcpy(ifrflags.ifr_name, name, sizeof(ifrflags.ifr_name));
	if (ioctl(fd, SIOCGIFFLAGS, (char *)&ifrflags) < 0) {
		if (errno == ENXIO || errno == ENODEV)
			return (0);	/* device doesn't actually exist - ignore it */
		(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
		    "SIOCGIFFLAGS: %.*s: %s",
		    (int)sizeof(ifrflags.ifr_name),
		    ifrflags.ifr_name,
		    pcap_strerror(errno));
		return (-1);
	}

	/*
	 * Add an entry for this interface, with no addresses.
	 */
	if (pcap_add_if(devlistp, name,
	    if_flags_to_pcap_flags(name, ifrflags.ifr_flags), NULL,
	    errbuf) == -1) {
		/*
		 * Failure.
		 */
		return (-1);
	}

	return (0);
}